

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base58.c
# Opt level: O0

uint32_t base58_get_checksum(uchar *bytes,size_t bytes_len)

{
  uint32_t local_38;
  uint32_t checksum;
  sha256 sha;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  sha.u._24_8_ = bytes_len;
  wally_sha256d(bytes,bytes_len,(uchar *)&local_38,0x20);
  wally_clear(&local_38,0x20);
  return local_38;
}

Assistant:

uint32_t base58_get_checksum(const unsigned char *bytes, size_t bytes_len)
{
    struct sha256 sha;
    uint32_t checksum;

    wally_sha256d(bytes, bytes_len, (unsigned char *)&sha, sizeof(sha));
    checksum = sha.u.u32[0];
    wally_clear(&sha, sizeof(sha));
    return checksum;
}